

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

t_emit * __thiscall xemmai::t_emit::operator<<(t_emit *this,double a_operand)

{
  bool bVar1;
  size_t i;
  double v0;
  double a_operand_local;
  t_emit *this_local;
  
  bVar1 = false;
  i = (size_t)a_operand;
  v0 = a_operand;
  a_operand_local = (double)this;
  while (!bVar1) {
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->v_code->v_instructions,(value_type *)&i);
    bVar1 = true;
  }
  return this;
}

Assistant:

t_emit& operator<<(double a_operand)
	{
		union
		{
			double v0;
			void* v1[sizeof(double) / sizeof(void*)];
		};
		v0 = a_operand;
		for (size_t i = 0; i < sizeof(double) / sizeof(void*); ++i) v_code->v_instructions.push_back(v1[i]);
		return *this;
	}